

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void clear_multi_selections(Am_Object *widget)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value_00;
  Am_Value value;
  Am_Value_List widget_list;
  Am_Object curr_widget;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(widget,0x1a0,1);
  Am_Value::operator=(&value,pAVar2);
  bVar1 = Am_Value::Valid(&value);
  if (bVar1) {
    bVar1 = Am_Value_List::Test(&value);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&widget_list,&value);
      Am_Value_List::Start(&widget_list);
      while( true ) {
        bVar1 = Am_Value_List::Last(&widget_list);
        if (bVar1) break;
        pAVar2 = Am_Value_List::Get(&widget_list);
        Am_Object::Am_Object(&curr_widget,pAVar2);
        bVar1 = Am_Object::operator!=(&curr_widget,widget);
        if (bVar1) {
          value_00 = Am_Value_List::operator_cast_to_Am_Wrapper_(&Am_No_Value_List);
          Am_Object::Set(&curr_widget,0x169,value_00,0);
        }
        Am_Object::~Am_Object(&curr_widget);
        Am_Value_List::Next(&widget_list);
      }
      Am_Value_List::~Am_Value_List(&widget_list);
    }
  }
  Am_Value::~Am_Value(&value);
  return;
}

Assistant:

void
draw_2_handles_for_line(
    int x1, int y1, int x2, int y2, bool filled, Am_Drawonable *draw,
    Am_Style style,
    Am_Object &handle_shape, //supports multiple users
    Am_Style special_style = Am_No_Style,
    Am_Move_Grow_Where_Attach special_style_where = Am_ATTACH_WHERE_HIT // 0
    )
{
  draw_handle(x1 - HANDLE_SIZE_D2, y1 - HANDLE_SIZE_D2, filled, draw,
              (special_style_where == Am_ATTACH_END_1) ? special_style : style,
              handle_shape); //supports multiple users

  draw_handle(x2 - HANDLE_SIZE_D2, y2 - HANDLE_SIZE_D2, filled, draw,
              (special_style_where == Am_ATTACH_END_2) ? special_style : style,
              handle_shape); //supports multiple users
}